

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadThreadsGraph.cc
# Opt level: O2

bool __thiscall
ReadThreadsGraph::add_thread
          (ReadThreadsGraph *this,int64_t thread_id,
          vector<NodePosition,_std::allocator<NodePosition>_> *node_positions,bool remove_duplicated
          ,int min_thread_nodes)

{
  pointer pNVar1;
  long lVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  undefined7 in_register_00000009;
  bool bVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ushort uVar9;
  vector<NodePosition,_std::allocator<NodePosition>_> *__range2;
  NodePosition *p;
  pointer pNVar10;
  ulong uVar11;
  Support support;
  long local_d0;
  undefined4 local_c4;
  ReadThreadsGraph *local_c0;
  sgNodeID_t local_b8;
  int64_t local_b0;
  int64_t thread_id_local;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> duplicated;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> seen;
  
  seen._M_h._M_buckets = &seen._M_h._M_single_bucket;
  seen._M_h._M_bucket_count = 1;
  seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seen._M_h._M_element_count = 0;
  seen._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  seen._M_h._M_rehash_policy._M_next_resize = 0;
  seen._M_h._M_single_bucket = (__node_base_ptr)0x0;
  duplicated._M_h._M_buckets = &duplicated._M_h._M_single_bucket;
  duplicated._M_h._M_bucket_count = 1;
  duplicated._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  duplicated._M_h._M_element_count = 0;
  duplicated._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  duplicated._M_h._M_rehash_policy._M_next_resize = 0;
  duplicated._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_c0 = this;
  local_b0 = thread_id;
  thread_id_local = thread_id;
  if ((ulong)(long)min_thread_nodes <=
      (ulong)((long)(node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4)) {
    local_c4 = (undefined4)CONCAT71(in_register_00000009,remove_duplicated);
    if (remove_duplicated) {
      std::
      _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear(&seen._M_h);
      std::
      _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear(&duplicated._M_h);
      pNVar1 = (node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (pNVar10 = (node_positions->
                     super__Vector_base<NodePosition,_std::allocator<NodePosition>_>)._M_impl.
                     super__Vector_impl_data._M_start; pNVar10 != pNVar1; pNVar10 = pNVar10 + 1) {
        lVar6 = pNVar10->node;
        local_d0 = -lVar6;
        if (0 < lVar6) {
          local_d0 = lVar6;
        }
        sVar3 = std::
                _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&seen._M_h,&local_d0);
        if (sVar3 == 0) {
          lVar6 = pNVar10->node;
          local_d0 = -lVar6;
          if (0 < lVar6) {
            local_d0 = lVar6;
          }
          std::__detail::
          _Insert<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert((_Insert<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                    *)&seen._M_h,&local_d0);
        }
        else {
          lVar6 = pNVar10->node;
          local_d0 = -lVar6;
          if (0 < lVar6) {
            local_d0 = lVar6;
          }
          std::__detail::
          _Insert<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert((_Insert<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                    *)&duplicated._M_h,&local_d0);
        }
      }
    }
    uVar8 = 0xffffffffffffffff;
    lVar6 = 0;
    uVar11 = 0;
    uVar9 = 0;
    while( true ) {
      pNVar10 = (node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
                _M_impl.super__Vector_impl_data._M_start;
      iVar7 = (int)uVar8;
      if ((ulong)((long)(node_positions->
                        super__Vector_base<NodePosition,_std::allocator<NodePosition>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pNVar10 >> 4) <= uVar11) break;
      if ((char)local_c4 == '\0') {
LAB_00234f09:
        if (iVar7 == -1) {
          local_b8 = *(sgNodeID_t *)
                      ((long)&((node_positions->
                               super__Vector_base<NodePosition,_std::allocator<NodePosition>_>).
                               _M_impl.super__Vector_impl_data._M_start)->node + lVar6);
        }
        else {
          pNVar10 = (node_positions->super__Vector_base<NodePosition,_std::allocator<NodePosition>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          support._0_8_ = (ulong)uVar9 << 0x10 | 7;
          support.id = local_b0;
          DistanceGraph::add_link
                    (&local_c0->super_DistanceGraph,-pNVar10[iVar7].node,
                     *(sgNodeID_t *)((long)&pNVar10->node + lVar6),
                     *(int *)((long)&pNVar10->start + lVar6) - pNVar10[iVar7].end,support);
          uVar9 = uVar9 + 1;
        }
        uVar8 = uVar11 & 0xffffffff;
      }
      else {
        lVar2 = *(long *)((long)&pNVar10->node + lVar6);
        local_d0 = -lVar2;
        if (0 < lVar2) {
          local_d0 = lVar2;
        }
        sVar3 = std::
                _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::count(&duplicated._M_h,&local_d0);
        if (sVar3 == 0) goto LAB_00234f09;
      }
      uVar11 = uVar11 + 1;
      lVar6 = lVar6 + 0x10;
    }
    if (iVar7 != -1) {
      lVar6 = pNVar10[iVar7].node;
      pmVar4 = std::__detail::
               _Map_base<long,_std::pair<const_long,_ThreadInfo>,_std::allocator<std::pair<const_long,_ThreadInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long,_std::pair<const_long,_ThreadInfo>,_std::allocator<std::pair<const_long,_ThreadInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_c0->thread_info,&thread_id_local);
      pmVar4->start = local_b8;
      pmVar4->end = -lVar6;
      pmVar4->link_count = uVar9;
      bVar5 = true;
      goto LAB_00234fa0;
    }
  }
  bVar5 = false;
LAB_00234fa0:
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&duplicated._M_h);
  std::
  _Hashtable<long,_long,_std::allocator<long>,_std::__detail::_Identity,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&seen._M_h);
  return bVar5;
}

Assistant:

bool ReadThreadsGraph::add_thread(int64_t thread_id, const std::vector<NodePosition> &node_positions, bool remove_duplicated, int min_thread_nodes) {
    std::unordered_set<sgNodeID_t> seen,duplicated;
    if (node_positions.size()<min_thread_nodes) return false;
    if (remove_duplicated) {
        seen.clear();
        duplicated.clear();
        for (const auto &p:node_positions){
            if (seen.count(llabs(p.node))) duplicated.insert(llabs(p.node));
            else seen.insert(llabs(p.node));
        }
    }
    uint16_t lidx=0;
    int32_t last_valid_i=-1;
    sgNodeID_t end1;
    for (int32_t i = 0; i < node_positions.size(); ++i) {
        if (remove_duplicated and  duplicated.count(llabs(node_positions[i].node))) continue;
        if (last_valid_i!=-1) {
            add_link(-node_positions[last_valid_i].node, node_positions[i].node,
                     node_positions[i].start - node_positions[last_valid_i].end,
                     {SupportType::LongRead, lidx++, thread_id});
        }
        else end1=node_positions[i].node;
        last_valid_i=i;
    }
    if (last_valid_i==-1) return false;
    sgNodeID_t end2=-node_positions[last_valid_i].node;
    thread_info[thread_id]={end1, end2, lidx};
    return true;
}